

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.c
# Opt level: O0

OrthographicCamera *
create_ortho_camera(OrthographicCamera *__return_storage_ptr__,Vec3 pos,Vec3 target,float ratio,
                   float scale)

{
  Vec3 VVar1;
  OrthographicCamera *rval;
  undefined8 local_180;
  float local_178;
  undefined8 local_140;
  float local_138;
  undefined8 local_c0;
  float local_b8;
  float scale_local;
  float ratio_local;
  Vec3 target_local;
  Vec3 pos_local;
  
  (__return_storage_ptr__->eye).z = pos.z;
  (__return_storage_ptr__->eye).x = (float)(int)pos._0_8_;
  (__return_storage_ptr__->eye).y = (float)(int)((ulong)pos._0_8_ >> 0x20);
  VVar1 = vsub(pos,target);
  VVar1 = normalized(VVar1);
  local_b8 = VVar1.z;
  local_c0 = VVar1._0_8_;
  __return_storage_ptr__->basis[2].z = local_b8;
  __return_storage_ptr__->basis[2].x = (float)(undefined4)local_c0;
  __return_storage_ptr__->basis[2].y = (float)local_c0._4_4_;
  VVar1.z = 1.0;
  VVar1.x = 0.00123;
  VVar1.y = -0.000987;
  VVar1 = cross(VVar1,__return_storage_ptr__->basis[2]);
  VVar1 = normalized(VVar1);
  local_138 = VVar1.z;
  local_140 = VVar1._0_8_;
  __return_storage_ptr__->basis[0].z = local_138;
  __return_storage_ptr__->basis[0].x = (float)(undefined4)local_140;
  __return_storage_ptr__->basis[0].y = (float)local_140._4_4_;
  VVar1 = cross(__return_storage_ptr__->basis[2],__return_storage_ptr__->basis[0]);
  local_180 = VVar1._0_8_;
  local_178 = VVar1.z;
  __return_storage_ptr__->basis[1].x = (float)(undefined4)local_180;
  __return_storage_ptr__->basis[1].y = (float)local_180._4_4_;
  __return_storage_ptr__->basis[1].z = local_178;
  __return_storage_ptr__->xscale = ratio * scale;
  __return_storage_ptr__->yscale = scale;
  return __return_storage_ptr__;
}

Assistant:

OrthographicCamera create_ortho_camera(Vec3 pos, Vec3 target, float ratio, float scale) {
    OrthographicCamera rval;

    rval.eye = pos;
    rval.basis[2] = normalized(vsub(pos, target));
    rval.basis[0] = normalized(
        cross((Vec3) {0.00123f, -0.000987f, 1.0f}, rval.basis[2])
        );
    rval.basis[1] = cross(rval.basis[2], rval.basis[0]);

    rval.xscale = ratio * scale;
    rval.yscale = scale;

    return rval;
}